

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_SetCutIsContainedOrder(Lf_Cut_t *pBase,Lf_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  int nSizeC;
  int k;
  int nSizeB;
  int i;
  Lf_Cut_t *pCut_local;
  Lf_Cut_t *pBase_local;
  
  uVar1 = *(uint *)&pBase->field_0x14 >> 0x18;
  uVar2 = *(uint *)&pCut->field_0x14 >> 0x18;
  if (uVar1 == uVar2) {
    for (k = 0; k < (int)uVar1; k = k + 1) {
      if (*(int *)((long)&pBase[1].Sign + (long)k * 4) !=
          *(int *)((long)&pCut[1].Sign + (long)k * 4)) {
        return 0;
      }
    }
    pBase_local._4_4_ = 1;
  }
  else {
    if (uVar1 <= uVar2) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                    ,0x329,"int Lf_SetCutIsContainedOrder(Lf_Cut_t *, Lf_Cut_t *)");
    }
    if (uVar2 == 0) {
      pBase_local._4_4_ = 1;
    }
    else {
      local_2c = 0;
      for (k = 0; k < (int)uVar1; k = k + 1) {
        if (*(int *)((long)&pCut[1].Sign + (long)(int)local_2c * 4) <
            *(int *)((long)&pBase[1].Sign + (long)k * 4)) {
          return 0;
        }
        if ((*(int *)((long)&pBase[1].Sign + (long)k * 4) ==
             *(int *)((long)&pCut[1].Sign + (long)(int)local_2c * 4)) &&
           (local_2c = local_2c + 1, local_2c == uVar2)) {
          return 1;
        }
      }
      pBase_local._4_4_ = 0;
    }
  }
  return pBase_local._4_4_;
}

Assistant:

static inline int Lf_SetCutIsContainedOrder( Lf_Cut_t * pBase, Lf_Cut_t * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = pBase->nLeaves;
    int k, nSizeC = pCut->nLeaves;
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pBase->pLeaves[i] != pCut->pLeaves[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pBase->pLeaves[i] > pCut->pLeaves[k] )
            return 0;
        if ( pBase->pLeaves[i] == pCut->pLeaves[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}